

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_plugin.c
# Opt level: O1

void mk_plugin_exit_all(mk_server *server)

{
  mk_list *pmVar1;
  mk_list *pmVar2;
  mk_list *pmVar3;
  mk_list *pmVar4;
  mk_list *pmVar5;
  mk_list *__mptr_1;
  mk_list *__mptr;
  mk_list *pmVar6;
  
  for (pmVar6 = (server->plugins).next; pmVar6 != &server->plugins; pmVar6 = pmVar6->next) {
    (*(code *)pmVar6[-4].prev)(&pmVar6[-8].next);
  }
  pmVar6 = (server->plugins).next;
  while (pmVar5 = pmVar6, pmVar5 != &server->plugins) {
    pmVar1 = pmVar5->prev;
    pmVar6 = pmVar5->next;
    pmVar1->next = pmVar6;
    pmVar6->prev = pmVar1;
    pmVar5->prev = (mk_list *)0x0;
    pmVar5->next = (mk_list *)0x0;
    pmVar1 = pmVar5[1].next;
    while (pmVar1 != pmVar5 + 1) {
      pmVar2 = pmVar1->next;
      pmVar3 = pmVar1[-1].prev;
      pmVar4 = pmVar1[-1].next;
      pmVar3->next = pmVar4;
      pmVar4->prev = pmVar3;
      pmVar1[-1].prev = (mk_list *)0x0;
      pmVar1[-1].next = (mk_list *)0x0;
      pmVar3 = pmVar1->prev;
      pmVar4 = pmVar1->next;
      pmVar3->next = pmVar4;
      pmVar4->prev = pmVar3;
      pmVar1->prev = (mk_list *)0x0;
      pmVar1->next = (mk_list *)0x0;
      free(pmVar1 + -5);
      pmVar1 = pmVar2;
    }
    if (*(int *)&pmVar5[2].prev == 0) {
      if (pmVar5[-3].next != (mk_list *)0x0) {
        free(pmVar5[-3].next);
      }
      free(&pmVar5[-8].next);
    }
    else if (*(int *)&pmVar5[2].prev == 1) {
      free(pmVar5[-1].prev);
      dlclose(pmVar5[-2].next);
    }
  }
  free(server->api);
  return;
}

Assistant:

void mk_plugin_exit_all(struct mk_server *server)
{
    struct mk_plugin *plugin;
    struct mk_list *head, *tmp;

    /* Plugins */
    mk_list_foreach(head, &server->plugins) {
        plugin = mk_list_entry(head, struct mk_plugin, _head);
        plugin->exit_plugin(plugin);
    }

    /* Plugin interface it self */
    mk_list_foreach_safe(head, tmp, &server->plugins) {
        plugin = mk_list_entry(head, struct mk_plugin, _head);
        mk_list_del(&plugin->_head);
        mk_plugin_exit_stages(plugin);

        if (plugin->load_type == MK_PLUGIN_DYNAMIC) {
            mk_mem_free(plugin->path);
#ifdef _WIN32
            FreeLibrary((HMODULE)plugin->handler);
#else
            dlclose(plugin ->handler);
#endif
        }
        else if (plugin->load_type == MK_PLUGIN_STATIC) {
            if (plugin->network != NULL) {
                mk_mem_free(plugin->network);
            }

            mk_mem_free(plugin);
        }
    }

    mk_mem_free(server->api);
    mk_mem_free(plg_stagemap);
}